

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O0

void __thiscall
Diligent::DXCompilerLibrary::DXCompilerLibrary
          (DXCompilerLibrary *this,DXCompilerTarget Target,char *LibName)

{
  char *local_40;
  allocator<char> local_21;
  char *local_20;
  char *LibName_local;
  DXCompilerLibrary *pDStack_10;
  DXCompilerTarget Target_local;
  DXCompilerLibrary *this_local;
  
  this->m_Target = Target;
  local_40 = LibName;
  if (LibName == (char *)0x0) {
    local_40 = "";
  }
  local_20 = LibName;
  LibName_local._4_4_ = Target;
  pDStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_LibName,local_40,&local_21);
  std::allocator<char>::~allocator(&local_21);
  std::mutex::mutex(&this->m_LibraryMtx);
  this->m_Library = (void *)0x0;
  std::atomic<bool>::atomic(&this->m_Loaded,false);
  this->m_DxcCreateInstance = (DxcCreateInstanceProc)0x0;
  Version::Version(&this->m_Version);
  Version::Version(&this->m_MaxShaderModel);
  return;
}

Assistant:

DXCompilerLibrary(DXCompilerTarget Target, const char* LibName) noexcept :
        m_Target{Target},
        m_LibName{LibName != nullptr ? LibName : ""}
    {
    }